

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLException.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XMLException::XMLException
          (XMLException *this,char *srcFile,XMLFileLoc srcLine,MemoryManager *memoryManager)

{
  int iVar1;
  MemoryManager *pMVar2;
  undefined4 extraout_var;
  char *pcVar3;
  MemoryManager *memoryManager_local;
  XMLFileLoc srcLine_local;
  char *srcFile_local;
  XMLException *this_local;
  
  XMemory::XMemory((XMemory *)this);
  this->_vptr_XMLException = (_func_int **)&PTR__XMLException_005269b8;
  this->fCode = NoError;
  this->fSrcFile = (char *)0x0;
  this->fSrcLine = srcLine;
  this->fMsg = (XMLCh *)0x0;
  this->fMemoryManager = (MemoryManager *)0x0;
  if (memoryManager == (MemoryManager *)0x0) {
    pMVar2 = (MemoryManager *)(**(code **)(*XMLPlatformUtils::fgMemoryManager + 0x10))();
    this->fMemoryManager = pMVar2;
  }
  else {
    iVar1 = (*memoryManager->_vptr_MemoryManager[2])();
    this->fMemoryManager = (MemoryManager *)CONCAT44(extraout_var,iVar1);
  }
  pcVar3 = XMLString::replicate(srcFile,this->fMemoryManager);
  this->fSrcFile = pcVar3;
  return;
}

Assistant:

XMLException::XMLException( const   char* const     srcFile
                            , const XMLFileLoc      srcLine
                            , MemoryManager* const  memoryManager) :

    fCode(XMLExcepts::NoError)
    , fSrcFile(0)
    , fSrcLine(srcLine)
    , fMsg(0)
    , fMemoryManager(0)
{
    if (!memoryManager)
      fMemoryManager =
        XMLPlatformUtils::fgMemoryManager->getExceptionMemoryManager();
    else
      fMemoryManager = memoryManager->getExceptionMemoryManager();

    fSrcFile = XMLString::replicate(srcFile, fMemoryManager);
}